

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::SupportedInVS
          (ShaderImageLoadStoreBase *this,int requiredVS)

{
  int iVar1;
  ostream *poVar2;
  GLint imagesVS;
  ostringstream reason;
  int local_1bc;
  string local_1b8;
  ostringstream local_198 [376];
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90ca,&local_1bc);
  iVar1 = local_1bc;
  if (local_1bc < requiredVS) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"Required ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,requiredVS);
    poVar2 = std::operator<<(poVar2," VS image uniforms but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1bc);
    poVar2 = std::operator<<(poVar2," available.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return requiredVS <= iVar1;
}

Assistant:

bool SupportedInVS(int requiredVS)
	{
		GLint imagesVS;
		glGetIntegerv(GL_MAX_VERTEX_IMAGE_UNIFORMS, &imagesVS);
		if (imagesVS >= requiredVS)
			return true;
		else
		{
			std::ostringstream reason;
			reason << "Required " << requiredVS << " VS image uniforms but only " << imagesVS << " available."
				   << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
	}